

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall
f8n::runtime::MessageQueue::UnregisterForBroadcasts(MessageQueue *this,IMessageTarget *target)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  _Atomic_word *p_Var3;
  int iVar4;
  int iVar5;
  IMessageTarget *pIVar6;
  _Base_ptr p_Var7;
  _Base_ptr this_00;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_std::_Rb_tree_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  pVar9;
  weak_ptr<f8n::runtime::IMessageTarget> it;
  LockT lock;
  key_type local_50;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->queueMutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  p_Var7 = (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->receivers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(p_Var7 + 1);
      local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_parent;
      if ((_Base_ptr)
          local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)&((_Base_ptr)
                                  local_50.
                                  super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_M_parent + 4);
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        else {
          piVar2 = (int *)((long)&((_Base_ptr)
                                  local_50.
                                  super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_M_parent + 4);
          *piVar2 = *piVar2 + 1;
        }
      }
      this_00 = (_Base_ptr)
                local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if ((_Base_ptr)
          local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Base_ptr)0x0) {
        iVar5 = *(int *)&((_Base_ptr)
                         local_50.
                         super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_parent;
        do {
          if (iVar5 == 0) {
            this_00 = (_Base_ptr)0x0;
            break;
          }
          LOCK();
          iVar4 = *(int *)&((_Base_ptr)
                           local_50.
                           super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_parent;
          bVar8 = iVar5 == iVar4;
          if (bVar8) {
            *(int *)&((_Base_ptr)
                     local_50.
                     super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent = iVar5 + 1;
            iVar4 = iVar5;
          }
          iVar5 = iVar4;
          UNLOCK();
        } while (!bVar8);
      }
      if (this_00 == (_Base_ptr)0x0) {
        bVar8 = true;
      }
      else {
        bVar8 = *(int *)&this_00->_M_parent == 0;
      }
      pIVar6 = local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (bVar8) {
        pIVar6 = (IMessageTarget *)0x0;
      }
      if (pIVar6 == target && pIVar6 != (IMessageTarget *)0x0) {
        pVar9 = std::
                _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
                ::equal_range(&(this->receivers)._M_t,&local_50);
        std::
        _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
        ::_M_erase_aux(&(this->receivers)._M_t,(_Base_ptr)pVar9.first._M_node,
                       (_Base_ptr)pVar9.second._M_node);
        if (this_00 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        if ((_Base_ptr)
            local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3 = &(local_50.
                       super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_weak_count;
            iVar5 = *p_Var3;
            *p_Var3 = *p_Var3 + -1;
            UNLOCK();
          }
          else {
            iVar5 = (local_50.
                     super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
            (local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
          }
          if (iVar5 == 1) {
            (*(local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
          }
        }
        break;
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((_Base_ptr)
          local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(local_50.
                     super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar5 = *p_Var3;
          *p_Var3 = *p_Var3 + -1;
          UNLOCK();
        }
        else {
          iVar5 = (local_50.
                   super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*(local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void MessageQueue::UnregisterForBroadcasts(IMessageTarget *target) {
    LockT lock(this->queueMutex);
    for (auto it : this->receivers) {
        auto shared = it.lock();
        if (shared && shared.get() == target) {
            this->receivers.erase(it);
            return;
        }
    }
}